

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetPropertyWithDescriptor<false>
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyRecord *propertyRecord,DictionaryPropertyDescriptor<unsigned_short> **pdescriptor,
          Var value,PropertyOperationFlags flags,PropertyValueInfo *info)

{
  Type *pTVar1;
  PropertyAttributes PVar2;
  RecyclerWeakReference<Js::DynamicObject> *pRVar3;
  code *pcVar4;
  uint propertyId;
  bool bVar5;
  bool bVar6;
  Flags FVar7;
  unsigned_short uVar8;
  BOOL BVar9;
  undefined4 *puVar10;
  Var aValue;
  RecyclableObject *function;
  Flags FVar11;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar12;
  Var pvVar13;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> local_60;
  PropertyRecord *local_58;
  PropertyRecord *propertyRecord_local;
  Var local_48;
  DictionaryTypeHandlerBase<unsigned_short> *local_40;
  uint local_34;
  
  local_58 = propertyRecord;
  propertyRecord_local._4_4_ = flags;
  local_40 = this;
  if ((pdescriptor == (DictionaryPropertyDescriptor<unsigned_short> **)0x0) ||
     (pDVar12 = *pdescriptor, pDVar12 == (DictionaryPropertyDescriptor<unsigned_short> *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e3,"(pdescriptor && *pdescriptor)","pdescriptor && *pdescriptor"
                               );
    if (!bVar5) goto LAB_00c2e6a2;
    *puVar10 = 0;
    pDVar12 = *pdescriptor;
  }
  local_34 = propertyRecord->pid;
  bVar5 = instance == (DynamicObject *)0x0;
  local_48 = value;
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e6,"(instance)","instance");
    if (!bVar6) goto LAB_00c2e6a2;
    *puVar10 = 0;
  }
  if ((pDVar12->Attributes & 8) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e7,
                                "((descriptor->Attributes & 0x08) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()))"
                                ,
                                "(descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed())"
                               );
    if (!bVar6) goto LAB_00c2e6a2;
    *puVar10 = 0;
  }
  if (((local_40->super_DynamicTypeHandler).flags & 0x18) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2ea,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar6) goto LAB_00c2e6a2;
    *puVar10 = 0;
  }
  pRVar3 = (local_40->singletonInstance).ptr;
  if (pRVar3 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    if ((DynamicObject *)(pRVar3->super_RecyclerWeakReferenceBase).strongRef == instance) {
      bVar5 = true;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x2ed,
                                  "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                 );
      if (!bVar5) goto LAB_00c2e6a2;
      *puVar10 = 0;
      bVar5 = false;
    }
  }
  uVar8 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(pDVar12);
  pvVar13 = local_48;
  if (uVar8 == 0xffff) {
    uVar8 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar12);
    pvVar13 = local_48;
    if (uVar8 != 0xffff) {
      uVar8 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar12);
      aValue = DynamicObject::GetSlot(instance,(uint)uVar8);
      function = VarTo<Js::RecyclableObject>(aValue);
      JavascriptOperators::CallSetter(function,instance,pvVar13,(ScriptContext *)0x0);
      bVar5 = JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetReference<Js::PropertyRecord_const*>
                        ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)(local_40->propertyMap).ptr,&local_58,pdescriptor);
      if (bVar5) {
        pDVar12 = *pdescriptor;
        uVar8 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(pDVar12);
        if (uVar8 == 0xffff) {
          uVar8 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar12);
          if (uVar8 != 0xffff) {
            uVar8 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar12);
            if (info != (PropertyValueInfo *)0x0) {
              PVar2 = pDVar12->Attributes;
              info->m_instance = &instance->super_RecyclableObject;
              info->m_propertyIndex = uVar8;
              info->m_attributes = PVar2;
              info->flags = InlineCacheSetterFlag;
            }
          }
        }
        else if (info != (PropertyValueInfo *)0x0) {
          PVar2 = pDVar12->Attributes;
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = uVar8;
          info->m_attributes = PVar2;
          info->flags = InlineCacheNoFlags;
        }
      }
      else {
        *pdescriptor = (DictionaryPropertyDescriptor<unsigned_short> *)0x0;
      }
    }
    goto LAB_00c2e5be;
  }
  if ((pDVar12->flags & IsInitialized) == None) {
    if ((((propertyRecord_local._4_4_ & PropertyOperation_PreInit) == PropertyOperation_None) &&
        (pDVar12->flags = pDVar12->flags | IsInitialized, bVar5)) &&
       ((propertyRecord_local._4_4_ &
        (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) == PropertyOperation_None
        && 0xf < local_34)) {
      if (local_48 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x305,"(value != nullptr)","value != nullptr");
        if (!bVar5) goto LAB_00c2e6a2;
        *puVar10 = 0;
      }
      BVar9 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
      if (BVar9 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x307,"(!instance->IsExternal())","!instance->IsExternal()");
        if (!bVar5) {
LAB_00c2e6a2:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar10 = 0;
      }
      bVar5 = VarIs<Js::JavascriptFunction>(pvVar13);
      if (bVar5) {
        bVar5 = DynamicTypeHandler::ShouldFixMethodProperties();
LAB_00c2e67f:
        FVar11 = pDVar12->flags & ~IsFixed;
        if (bVar5 == false) goto LAB_00c2e695;
        FVar7 = IsFixed;
      }
      else {
        bVar5 = DynamicTypeHandler::ShouldFixDataProperties();
        if (bVar5) {
          bVar5 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_34,pvVar13);
          goto LAB_00c2e67f;
        }
        FVar11 = pDVar12->flags & ~IsFixed;
LAB_00c2e695:
        FVar7 = None;
      }
      pDVar12->flags = FVar11 | FVar7;
    }
  }
  else {
    InvalidateFixedField<int>(local_40,instance,local_34,pDVar12);
  }
  pvVar13 = local_48;
  DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar8,local_48);
  if ((pDVar12->flags & (IsFixed|IsInitialized)) == IsInitialized) {
    if (info != (PropertyValueInfo *)0x0) {
      PVar2 = pDVar12->Attributes;
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = uVar8;
      info->m_attributes = PVar2;
      info->flags = InlineCacheNoFlags;
    }
  }
  else if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = &instance->super_RecyclableObject;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
  }
LAB_00c2e5be:
  propertyId = local_34;
  bVar5 = NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(local_34);
  if ((bVar5) &&
     (pTVar1 = &(local_40->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
     ((local_40->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::WriteBarrierSet
              (&local_60,
               &((((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                   super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                javascriptLibrary)->typesWithNoSpecialPropertyProtoChain);
    PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(local_60.ptr);
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&local_40->super_DynamicTypeHandler,instance,propertyId,pvVar13,SideEffects_Any);
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::SetPropertyWithDescriptor(
        _In_ DynamicObject* instance,
        _In_ PropertyRecord const* propertyRecord,
        _Inout_ DictionaryPropertyDescriptor<T> ** pdescriptor,
        _In_ Var value,
        _In_ PropertyOperationFlags flags,
        _Inout_opt_ PropertyValueInfo* info)
    {
        Assert(pdescriptor && *pdescriptor);
        DictionaryPropertyDescriptor<T> * descriptor = *pdescriptor;
        PropertyId propertyId = propertyRecord->GetPropertyId();
        Assert(instance);
        Assert((descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()));

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
#endif
        T dataSlotAllowLetConstGlobal = descriptor->template GetDataPropertyIndex<allowLetConstGlobal>();
        if (dataSlotAllowLetConstGlobal != NoSlots)
        {
            if (allowLetConstGlobal
                && (descriptor->Attributes & PropertyNoRedecl)
                && !(flags & PropertyOperation_AllowUndecl))
            {
                ScriptContext* scriptContext = instance->GetScriptContext();
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(dataSlotAllowLetConstGlobal)))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }
#if ENABLE_FIXED_FIELDS
            if (!descriptor->GetIsInitialized())
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    descriptor->SetIsInitialized(true);
                    if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(instance, propertyId, descriptor);
            }
#endif
            SetSlotUnchecked(instance, dataSlotAllowLetConstGlobal, value);
            // If we just added a fixed method, don't populate the inline cache so that we always take the slow path
            // when overwriting this property and correctly invalidate any JIT-ed code that hard-coded this method.
            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, dataSlotAllowLetConstGlobal, GetLetConstGlobalPropertyAttributes<allowLetConstGlobal>(descriptor->Attributes));
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }
        else if (descriptor->GetSetterPropertyIndex() != NoSlots)
        {
            RecyclableObject* func = VarTo<RecyclableObject>(instance->GetSlot(descriptor->GetSetterPropertyIndex()));
            JavascriptOperators::CallSetter(func, instance, value, NULL);

            // Wait for the setter to return before setting up the inline cache info, as the setter may change
            // the attributes

            if (propertyMap->TryGetReference(propertyRecord, pdescriptor))
            {
                descriptor = *pdescriptor;
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, dataSlot, descriptor->Attributes);
                }
                else if (descriptor->GetSetterPropertyIndex() != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, descriptor->GetSetterPropertyIndex(), descriptor->Attributes, InlineCacheSetterFlag);
                }
            }
            else
            {
                *pdescriptor = nullptr;
            }
        }
        if (NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyId))
        {
            this->SetHasSpecialProperties();
            if (GetFlags() & IsPrototypeFlag)
            {
                instance->GetScriptContext()->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
            }
        }
        SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
    }